

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebuilder.cpp
# Opt level: O1

Error __thiscall asmjit::CodeBuilder::getCBLabel(CodeBuilder *this,CBLabel **pOut,uint32_t id)

{
  ZoneVector<asmjit::CBLabel_*> *this_00;
  CodeHolder *pCVar1;
  Error EVar2;
  CBLabel *pCVar3;
  ulong uVar4;
  size_t local_30;
  
  EVar2 = (this->super_CodeEmitter)._lastError;
  if (EVar2 != 0) {
    return EVar2;
  }
  pCVar1 = (this->super_CodeEmitter)._code;
  if (pCVar1 == (CodeHolder *)0x0) {
    getCBLabel();
    return 0xc;
  }
  uVar4 = (ulong)(id - 0x100);
  if ((pCVar1->_labels).super_ZoneVectorBase._length <= uVar4) {
    return 0xc;
  }
  this_00 = &this->_cbLabels;
  if (((this->_cbLabels).super_ZoneVectorBase._length <= uVar4) &&
     (EVar2 = ZoneVectorBase::_resize(&this_00->super_ZoneVectorBase,&this->_cbHeap,8,uVar4 + 1),
     EVar2 != 0)) {
    return EVar2;
  }
  if (uVar4 < (this->_cbLabels).super_ZoneVectorBase._length) {
    pCVar3 = *(CBLabel **)((long)(this_00->super_ZoneVectorBase)._data + uVar4 * 8);
    if (pCVar3 != (CBLabel *)0x0) {
LAB_00162cdb:
      *pOut = pCVar3;
      return 0;
    }
    if ((this->_cbHeap)._zone != (Zone *)0x0) {
      pCVar3 = (CBLabel *)ZoneHeap::_alloc(&this->_cbHeap,0x38,&local_30);
      (pCVar3->super_CBNode)._prev = (CBNode *)0x0;
      (pCVar3->super_CBNode)._next = (CBNode *)0x0;
      (pCVar3->super_CBNode)._type = '\x04';
      (pCVar3->super_CBNode)._opCount = '\0';
      (pCVar3->super_CBNode)._flags = (uint16_t)this->_nodeFlags;
      (pCVar3->super_CBNode)._position = this->_position;
      (pCVar3->super_CBNode)._inlineComment = (char *)0x0;
      (pCVar3->super_CBNode)._passData = (void *)0x0;
      pCVar3->_id = id;
      pCVar3->_numRefs = 0;
      pCVar3->_from = (CBJump *)0x0;
      if (uVar4 < (this->_cbLabels).super_ZoneVectorBase._length) {
        *(CBLabel **)((long)(this_00->super_ZoneVectorBase)._data + uVar4 * 8) = pCVar3;
        goto LAB_00162cdb;
      }
      goto LAB_00162d04;
    }
  }
  else {
    getCBLabel();
  }
  getCBLabel();
LAB_00162d04:
  getCBLabel();
}

Assistant:

Error CodeBuilder::getCBLabel(CBLabel** pOut, uint32_t id) noexcept {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  size_t index = Operand::unpackId(id);
  if (ASMJIT_UNLIKELY(index >= _code->getLabelsCount()))
    return DebugUtils::errored(kErrorInvalidLabel);

  if (index >= _cbLabels.getLength())
    ASMJIT_PROPAGATE(_cbLabels.resize(&_cbHeap, index + 1));

  CBLabel* node = _cbLabels[index];
  if (!node) {
    node = newNodeT<CBLabel>(id);
    if (ASMJIT_UNLIKELY(!node))
      return DebugUtils::errored(kErrorNoHeapMemory);
    _cbLabels[index] = node;
  }

  *pOut = node;
  return kErrorOk;
}